

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

vector<TCacheReq,_std::allocator<TCacheReq>_> *
PriorityQueueAssignment
          (vector<TCacheReq,_std::allocator<TCacheReq>_> *__return_storage_ptr__,TProblem *p)

{
  size_t sVar1;
  unsigned_long uVar2;
  ulong uVar3;
  value_type vVar4;
  double dVar5;
  iterator iVar6;
  bool bVar7;
  size_type sVar8;
  reference pvVar9;
  mapped_type *pmVar10;
  reference pTVar11;
  size_type sVar12;
  ostream *poVar13;
  size_type sVar14;
  const_reference pvVar15;
  reference pvVar16;
  _Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false> _Var17;
  pointer ppVar18;
  unsigned_long *puVar19;
  pair<std::__detail::_Node_iterator<TCacheReq,_true,_false>,_bool> pVar20;
  key_type local_218;
  key_type local_208;
  _Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false> local_1f8;
  key_type local_1f0;
  _Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false> local_1e0;
  iterator foundLatency;
  size_t e_1;
  ulong local_1b8;
  size_t newPriority;
  size_t priority;
  TCacheReq cacheRequest_1;
  value_type entry;
  double local_178;
  pair<TCacheReq,_unsigned_long> local_170;
  _Node_iterator_base<TCacheReq,_false> local_158;
  undefined1 local_150;
  undefined1 local_148 [8];
  TCacheReq cacheRequest;
  TCacheConn *cacheConn;
  iterator __end2;
  iterator __begin2;
  vector<TCacheConn,_std::allocator<TCacheConn>_> *__range2;
  TRequest *request;
  iterator __end1;
  iterator __begin1;
  vector<TRequest,_std::allocator<TRequest>_> *__range1;
  pointer ppStack_f0;
  pointer local_e8;
  undefined1 local_e0 [8];
  priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_discobot[P]hashcode_practice_run_cpp:216:16)>
  queue;
  anon_class_1_0_00000001 cmp;
  key_type local_b0;
  ulong local_a0;
  size_t v;
  size_t e;
  unordered_set<TCacheReq,_std::hash<TCacheReq>,_std::equal_to<TCacheReq>,_std::allocator<TCacheReq>_>
  addedCacheRequests;
  unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
  serveTime;
  TProblem *p_local;
  vector<TCacheReq,_std::allocator<TCacheReq>_> *result;
  
  std::vector<TCacheReq,_std::allocator<TCacheReq>_>::vector(__return_storage_ptr__);
  std::
  unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
  ::unordered_map((unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                   *)&addedCacheRequests._M_h._M_single_bucket);
  std::
  unordered_set<TCacheReq,_std::hash<TCacheReq>,_std::equal_to<TCacheReq>,_std::allocator<TCacheReq>_>
  ::unordered_set((unordered_set<TCacheReq,_std::hash<TCacheReq>,_std::equal_to<TCacheReq>,_std::allocator<TCacheReq>_>
                   *)&e);
  for (v = 0; sVar1 = v,
      sVar8 = std::vector<TEndpoint,_std::allocator<TEndpoint>_>::size(&p->Endpoints), sVar1 < sVar8
      ; v = v + 1) {
    for (local_a0 = 0; uVar3 = local_a0,
        sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&p->Vides),
        uVar3 < sVar8; local_a0 = local_a0 + 1) {
      pvVar9 = std::vector<TEndpoint,_std::allocator<TEndpoint>_>::operator[](&p->Endpoints,v);
      sVar1 = pvVar9->Latency;
      local_b0.EndpointId = v;
      local_b0.VideoId = local_a0;
      pmVar10 = std::
                unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                ::operator[]((unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                              *)&addedCacheRequests._M_h._M_single_bucket,&local_b0);
      *pmVar10 = sVar1;
    }
  }
  std::operator<<((ostream *)&std::cerr,"Serve times initialized\n");
  __range1 = (vector<TRequest,_std::allocator<TRequest>_> *)0x0;
  ppStack_f0 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  std::
  vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
  ::vector((vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
            *)&__range1);
  std::
  priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
  ::priority_queue((priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_discobot[P]hashcode_practice_run_cpp:216:16)>
                    *)local_e0,(anon_class_1_0_00000001 *)&queue.field_0x1b,
                   (vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                    *)&__range1);
  std::
  vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
  ::~vector((vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
             *)&__range1);
  __end1 = std::vector<TRequest,_std::allocator<TRequest>_>::begin(&p->Requests);
  request = (TRequest *)std::vector<TRequest,_std::allocator<TRequest>_>::end(&p->Requests);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<TRequest_*,_std::vector<TRequest,_std::allocator<TRequest>_>_>
                                     *)&request), bVar7) {
    pTVar11 = __gnu_cxx::
              __normal_iterator<TRequest_*,_std::vector<TRequest,_std::allocator<TRequest>_>_>::
              operator*(&__end1);
    pvVar9 = std::vector<TEndpoint,_std::allocator<TEndpoint>_>::operator[]
                       (&p->Endpoints,pTVar11->EndpointId);
    __end2 = std::vector<TCacheConn,_std::allocator<TCacheConn>_>::begin(&pvVar9->Caches);
    cacheConn = (TCacheConn *)
                std::vector<TCacheConn,_std::allocator<TCacheConn>_>::end(&pvVar9->Caches);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<TCacheConn_*,_std::vector<TCacheConn,_std::allocator<TCacheConn>_>_>
                                       *)&cacheConn), bVar7) {
      cacheRequest.VideoId =
           (size_t)__gnu_cxx::
                   __normal_iterator<TCacheConn_*,_std::vector<TCacheConn,_std::allocator<TCacheConn>_>_>
                   ::operator*(&__end2);
      local_148 = (undefined1  [8])((reference)cacheRequest.VideoId)->ServerId;
      cacheRequest.ServerId = pTVar11->VideoId;
      sVar12 = std::
               unordered_set<TCacheReq,_std::hash<TCacheReq>,_std::equal_to<TCacheReq>,_std::allocator<TCacheReq>_>
               ::count((unordered_set<TCacheReq,_std::hash<TCacheReq>,_std::equal_to<TCacheReq>,_std::allocator<TCacheReq>_>
                        *)&e,(key_type *)local_148);
      if (sVar12 == 0) {
        pVar20 = std::
                 unordered_set<TCacheReq,_std::hash<TCacheReq>,_std::equal_to<TCacheReq>,_std::allocator<TCacheReq>_>
                 ::insert((unordered_set<TCacheReq,_std::hash<TCacheReq>,_std::equal_to<TCacheReq>,_std::allocator<TCacheReq>_>
                           *)&e,(value_type *)local_148);
        local_158._M_cur =
             (__node_type *)pVar20.first.super__Node_iterator_base<TCacheReq,_false>._M_cur;
        local_150 = pVar20.second;
        local_178 = CalcPriority(p,(unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                                    *)&addedCacheRequests._M_h._M_single_bucket,
                                 (TCacheReq *)local_148);
        std::pair<TCacheReq,_unsigned_long>::pair<TCacheReq_&,_double,_true>
                  (&local_170,(TCacheReq *)local_148,&local_178);
        std::
        priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
        ::push((priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_discobot[P]hashcode_practice_run_cpp:216:16)>
                *)local_e0,&local_170);
      }
      __gnu_cxx::
      __normal_iterator<TCacheConn_*,_std::vector<TCacheConn,_std::allocator<TCacheConn>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::__normal_iterator<TRequest_*,_std::vector<TRequest,_std::allocator<TRequest>_>_>::
    operator++(&__end1);
  }
  poVar13 = std::operator<<((ostream *)&std::cerr,"Starting\n");
  std::ostream::operator<<(poVar13,std::flush<char,std::char_traits<char>>);
  while (bVar7 = std::
                 priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
                 ::empty((priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_discobot[P]hashcode_practice_run_cpp:216:16)>
                          *)local_e0), ((bVar7 ^ 0xffU) & 1) != 0) {
    poVar13 = std::operator<<((ostream *)&std::cerr,"\rQueue size: ");
    sVar14 = std::
             priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
             ::size((priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_discobot[P]hashcode_practice_run_cpp:216:16)>
                     *)local_e0);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,sVar14);
    std::ostream::operator<<(poVar13,std::flush<char,std::char_traits<char>>);
    pvVar15 = std::
              priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
              ::top((priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_discobot[P]hashcode_practice_run_cpp:216:16)>
                     *)local_e0);
    uVar2 = pvVar15->second;
    cacheRequest_1.VideoId = (pvVar15->first).ServerId;
    sVar1 = (pvVar15->first).VideoId;
    std::
    priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
    ::pop((priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_discobot[P]hashcode_practice_run_cpp:216:16)>
           *)local_e0);
    priority = cacheRequest_1.VideoId;
    cacheRequest_1.ServerId = sVar1;
    pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&p->Capacities,cacheRequest_1.VideoId);
    uVar3 = *pvVar16;
    pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&p->Vides,cacheRequest_1.ServerId);
    if (*pvVar16 <= uVar3) {
      newPriority = uVar2;
      dVar5 = CalcPriority(p,(unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                              *)&addedCacheRequests._M_h._M_single_bucket,(TCacheReq *)&priority);
      local_1b8 = (long)dVar5 | (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f;
      if (uVar2 == local_1b8) {
        pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&p->Capacities,priority);
        uVar3 = *pvVar16;
        pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&p->Vides,cacheRequest_1.ServerId);
        if (*pvVar16 <= uVar3) {
          std::vector<TCacheReq,_std::allocator<TCacheReq>_>::push_back
                    (__return_storage_ptr__,(value_type *)&priority);
          pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&p->Vides,cacheRequest_1.ServerId);
          vVar4 = *pvVar16;
          pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&p->Capacities,priority);
          *pvVar16 = *pvVar16 - vVar4;
          for (foundLatency.
               super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>.
               _M_cur = (_Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>)
                        (__node_type *)0x0;
              iVar6.super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
              ._M_cur = foundLatency.
                        super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
                        ._M_cur,
              _Var17._M_cur =
                   (__node_type *)
                   std::vector<TEndpoint,_std::allocator<TEndpoint>_>::size(&p->Endpoints),
              (ulong)iVar6.
                     super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
                     ._M_cur < _Var17._M_cur;
              foundLatency.
              super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>.
              _M_cur = (_Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>)
                       ((long)foundLatency.
                              super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
                              ._M_cur + 1)) {
            local_1f0.EndpointId =
                 (size_t)foundLatency.
                         super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
                         ._M_cur;
            local_1f0.ServerId = priority;
            local_1e0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<TEndpointCache,_unsigned_long,_std::hash<TEndpointCache>,_std::equal_to<TEndpointCache>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>_>
                 ::find(&p->Latencies,&local_1f0);
            local_1f8._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<TEndpointCache,_unsigned_long,_std::hash<TEndpointCache>,_std::equal_to<TEndpointCache>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>_>
                 ::end(&p->Latencies);
            bVar7 = std::__detail::operator==(&local_1e0,&local_1f8);
            if (!bVar7) {
              local_208.EndpointId =
                   (size_t)foundLatency.
                           super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
                           ._M_cur;
              local_208.VideoId = cacheRequest_1.ServerId;
              pmVar10 = std::
                        unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                        ::operator[]((unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                                      *)&addedCacheRequests._M_h._M_single_bucket,&local_208);
              ppVar18 = std::__detail::
                        _Node_iterator<std::pair<const_TEndpointCache,_unsigned_long>,_false,_false>
                        ::operator->((_Node_iterator<std::pair<const_TEndpointCache,_unsigned_long>,_false,_false>
                                      *)&local_1e0);
              puVar19 = std::min<unsigned_long>(pmVar10,&ppVar18->second);
              uVar2 = *puVar19;
              local_218.EndpointId =
                   (size_t)foundLatency.
                           super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
                           ._M_cur;
              local_218.VideoId = cacheRequest_1.ServerId;
              pmVar10 = std::
                        unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                        ::operator[]((unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                                      *)&addedCacheRequests._M_h._M_single_bucket,&local_218);
              *pmVar10 = uVar2;
            }
          }
        }
      }
      else {
        std::pair<TCacheReq,_unsigned_long>::pair<TCacheReq_&,_unsigned_long_&,_true>
                  ((pair<TCacheReq,_unsigned_long> *)&e_1,(TCacheReq *)&priority,&local_1b8);
        std::
        priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
        ::push((priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_discobot[P]hashcode_practice_run_cpp:216:16)>
                *)local_e0,(value_type *)&e_1);
      }
    }
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::
  priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
  ::~priority_queue((priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_discobot[P]hashcode_practice_run_cpp:216:16)>
                     *)local_e0);
  std::
  unordered_set<TCacheReq,_std::hash<TCacheReq>,_std::equal_to<TCacheReq>,_std::allocator<TCacheReq>_>
  ::~unordered_set((unordered_set<TCacheReq,_std::hash<TCacheReq>,_std::equal_to<TCacheReq>,_std::allocator<TCacheReq>_>
                    *)&e);
  std::
  unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                    *)&addedCacheRequests._M_h._M_single_bucket);
  return __return_storage_ptr__;
}

Assistant:

std::vector<TCacheReq> PriorityQueueAssignment(TProblem& p) {
    std::vector<TCacheReq> result;
    std::unordered_map<TEndpointVideo, size_t> serveTime;
    std::unordered_set<TCacheReq> addedCacheRequests;
    for (size_t e = 0; e < p.Endpoints.size(); ++e) {
        for (size_t v = 0; v < p.Vides.size(); ++v) {
            serveTime[{e, v}] = p.Endpoints[e].Latency;
        }
    }
    std::cerr << "Serve times initialized\n";
    auto cmp = [&](auto& lhs, auto& rhs) { return lhs.second < rhs.second; };
    std::priority_queue<QueueEntry, std::vector<QueueEntry>, decltype(cmp)> queue(cmp);
    for (auto& request : p.Requests) {
        for (auto& cacheConn : p.Endpoints[request.EndpointId].Caches) {
            TCacheReq cacheRequest{cacheConn.ServerId, request.VideoId};
            if (addedCacheRequests.count(cacheRequest)) {
                continue;
            }
            addedCacheRequests.insert(cacheRequest);
            queue.push({cacheRequest, CalcPriority(p, serveTime, cacheRequest)});
        }
    }
    std::cerr << "Starting\n" << std::flush;
    while (!queue.empty()) {
        std::cerr << "\rQueue size: " << queue.size() << std::flush;
        auto entry = queue.top();
        queue.pop();
        auto cacheRequest = entry.first;
        if (p.Capacities[cacheRequest.ServerId] < p.Vides[cacheRequest.VideoId]) {
            continue;
        }
        size_t priority = entry.second;
        size_t newPriority = CalcPriority(p, serveTime, cacheRequest);
        if (entry.second != newPriority) {
            queue.push({cacheRequest, newPriority});
            continue;
        }
        if (p.Capacities[cacheRequest.ServerId] < p.Vides[cacheRequest.VideoId]) {
            continue;
        }
        result.push_back(cacheRequest);
        p.Capacities[cacheRequest.ServerId] -= p.Vides[cacheRequest.VideoId];
        for (size_t e = 0; e < p.Endpoints.size(); ++e) {
            auto foundLatency = p.Latencies.find({e, cacheRequest.ServerId});
            if (foundLatency == p.Latencies.end()) {
                continue;
            }
            serveTime[{e, cacheRequest.VideoId}] =
                std::min(serveTime[{e, cacheRequest.VideoId}], foundLatency->second);
        }
    }
    std::cerr << "\n";
    return result;
}